

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# global_state.cpp
# Opt level: O2

int cilkg_set_param(char *param,char *value)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  ulong uVar5;
  uint max;
  undefined8 in_RCX;
  undefined8 uVar6;
  char *val;
  int *piVar7;
  
  cilkg_get_user_settable_values();
  max = (uint)CONCAT71((int7)((ulong)in_RCX >> 8),value == (char *)0x0 || param == (char *)0x0);
  if (value == (char *)0x0 || param == (char *)0x0) {
    return 3;
  }
  val = "force reduce";
  bVar1 = anon_unknown.dwarf_a9c0::strmatch(param,"force reduce");
  if (bVar1) {
    bVar1 = anon_unknown.dwarf_a9c0::always_force_reduce();
    if (bVar1) {
      return 4;
    }
    iVar2 = (anonymous_namespace)::store_bool<int,char>((int *)value,val);
    return iVar2;
  }
  bVar1 = anon_unknown.dwarf_a9c0::strmatch(param,"nworkers");
  if (bVar1) {
    if (cilkg_singleton_ptr != (global_state_t *)0x0) {
      return 4;
    }
    iVar2 = __cilkrts_hardware_cpu_count();
    if (0 < iVar2) {
      iVar3 = __cilkrts_running_under_sequential_ptool();
      iVar4 = iVar2 << 4;
      if (iVar3 != 0) {
        iVar4 = 1;
      }
      iVar4 = (anonymous_namespace)::store_int<int,char>
                        ((int *)((anonymous_namespace)::global_state_singleton + 0x528),value,0,
                         iVar4);
      if ((anonymous_namespace)::global_state_singleton._1320_4_ == 0) {
        if (iVar3 == 0) {
          (anonymous_namespace)::global_state_singleton._1320_4_ = iVar2;
          return iVar4;
        }
        (anonymous_namespace)::global_state_singleton._1320_4_ = 1;
        return iVar4;
      }
      return iVar4;
    }
    uVar6 = 0x10d;
LAB_00109fcb:
    __cilkrts_bug("%s:%d: cilk assertion failed: %s\n",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/passlab[P]intel-cilk-runtime/runtime/global_state.cpp"
                  ,uVar6,"hardware_cpu_count > 0");
  }
  bVar1 = anon_unknown.dwarf_a9c0::strmatch(param,"max user workers");
  if (bVar1) {
    iVar2 = __cilkrts_hardware_cpu_count();
    if (iVar2 < 1) {
      uVar6 = 0x121;
      goto LAB_00109fcb;
    }
    iVar2 = iVar2 << 4;
    piVar7 = (int *)((anonymous_namespace)::global_state_singleton + 8);
    iVar4 = 1;
  }
  else {
    bVar1 = anon_unknown.dwarf_a9c0::strmatch(param,"local stacks");
    if (bVar1) {
      piVar7 = (int *)((anonymous_namespace)::global_state_singleton + 0x3c);
    }
    else {
      bVar1 = anon_unknown.dwarf_a9c0::strmatch(param,"shared stacks");
      if (!bVar1) {
        bVar1 = anon_unknown.dwarf_a9c0::strmatch(param,"nstacks");
        if (bVar1) {
          if (cilkg_singleton_ptr != (global_state_t *)0x0) {
            return 4;
          }
          iVar2 = (anonymous_namespace)::store_int<unsigned_int,char>
                            ((uint *)((anonymous_namespace)::global_state_singleton + 0x3b8),value,0
                             ,max);
          return iVar2;
        }
        bVar1 = anon_unknown.dwarf_a9c0::strmatch(param,"stack size");
        if (!bVar1) {
          return 1;
        }
        if (cilkg_singleton_ptr != (global_state_t *)0x0) {
          return 4;
        }
        piVar7 = __errno_location();
        *piVar7 = 0;
        uVar5 = anon_unknown.dwarf_a9c0::to_long(value);
        iVar2 = 2;
        if (uVar5 == 0) {
          if (*piVar7 != 0) {
            iVar2 = 3;
            goto LAB_00109f77;
          }
        }
        else if (0x7fffffff < uVar5) goto LAB_00109f77;
        iVar2 = 0;
        (anonymous_namespace)::global_state_singleton._960_8_ = uVar5;
LAB_00109f77:
        (anonymous_namespace)::global_state_singleton._960_8_ =
             cilkos_validate_stack_size((anonymous_namespace)::global_state_singleton._960_8_);
        return iVar2;
      }
      piVar7 = (int *)((anonymous_namespace)::global_state_singleton + 0x40);
    }
    iVar2 = 0x2a;
    iVar4 = 0;
  }
  iVar2 = (anonymous_namespace)::store_int<int,char>(piVar7,value,iVar4,iVar2);
  return iVar2;
}

Assistant:

int cilkg_set_param(const char* param, const char* value)
{
    return set_param_imp(cilkg_get_user_settable_values(), param, value);
}